

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconvert.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  double dVar2;
  anon_union_4_2_507e332c aVar3;
  anon_union_8_2_507e332c aVar4;
  uchar uVar5;
  uchar uVar6;
  byte bVar7;
  size_t sVar8;
  uint i;
  uint uVar9;
  char *pcVar10;
  uint i_1;
  long lVar11;
  uint uVar12;
  int iVar13;
  longdouble in_ST0;
  undefined2 uStack_aa;
  char conversion [10];
  byte bStack_99;
  uchar flt80_byte [16];
  byte bStack_85;
  uchar flt_byte [4];
  undefined4 local_64;
  uchar dbl_byte [8];
  
  if (argc - 4U < 0xfffffffe) {
    pcVar10 = "Usage: fpconvert <floating-point> [<conversion>]";
  }
  else {
    lVar11 = 0;
    flt.value = strtof(argv[1],(char **)0x0);
    dbl.value = strtod(argv[1],(char **)0x0);
    strtold(argv[1],(char **)0x0);
    aVar4 = dbl;
    aVar3 = flt;
    flt_byte[0] = flt._0_1_;
    flt_byte[1] = flt._1_1_;
    flt_byte[2] = flt._2_1_;
    flt_byte[3] = flt._3_1_;
    dbl_byte[0] = dbl._0_1_;
    dbl_byte[1] = dbl._1_1_;
    dbl_byte[2] = dbl._2_1_;
    dbl_byte[3] = dbl._3_1_;
    dbl_byte[4] = dbl._4_1_;
    dbl_byte[5] = dbl._5_1_;
    dbl_byte[6] = dbl._6_1_;
    dbl_byte[7] = dbl._7_1_;
    flt80_byte[10] = flt80._10_1_;
    flt80_byte[0xb] = flt80._11_1_;
    flt80_byte[0xc] = flt80._12_1_;
    flt80_byte[0xd] = flt80._13_1_;
    flt80_byte[0xe] = flt80._14_1_;
    flt80_byte[0xf] = flt80._15_1_;
    flt80_byte._0_10_ = in_ST0;
    flt80.value = in_ST0;
    puts("------------------- float --------------------");
    printf("Bits: %zu\n",0x20);
    printf("Hex:  %02x%02x.%02x%02x.\n",(ulong)((uint)aVar3 >> 0x18),
           (ulong)((uint)aVar3 >> 0x10 & 0xff),(ulong)((uint)aVar3 >> 8 & 0xff),
           (ulong)((uint)aVar3 & 0xff));
    local_64 = aVar4._3_4_ & 0xff;
    do {
      if (flt_byte[lVar11] != flt.byte[lVar11]) {
        __assert_fail("flt_byte[ i ] == flt.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0x74,"int main(int, char **)");
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    printf("Bin:  seee.eeee.efff.ffff.ffff.ffff.ffff.ffff.\n      ");
    lVar11 = 4;
    do {
      printf("%s.%s.",nibbles[flt_byte[lVar11 + -1] >> 4],nibbles[flt_byte[lVar11 + -1] & 0xf]);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    putchar(10);
    bVar7 = aVar3.byte[3] * '\x02' | aVar3.byte[2] >> 7;
    lVar11 = 0;
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)bVar7,(ulong)(bVar7 - 0x7f));
    puts("------------------ double --------------------");
    printf("Bits: %zu\n",0x40);
    uVar12 = aVar4._4_4_;
    printf("Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",(ulong)aVar4 >> 0x38,
           (ulong)(aVar4._6_2_ & 0xff),(ulong)(uVar12 >> 8 & 0xff),(ulong)(uVar12 & 0xff),
           (ulong)local_64,(ulong)(aVar4._2_4_ & 0xff),(ulong)(aVar4._1_4_ & 0xff),
           (ulong)(aVar4._0_4_ & 0xff));
    do {
      if (dbl_byte[lVar11] != dbl.byte[lVar11]) {
        __assert_fail("dbl_byte[ i ] == dbl.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0x90,"int main(int, char **)");
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    printf("Bin:  seee.eeee.eeee.ffff.ffff.ffff.ffff.ffff.\n      ");
    lVar11 = 8;
    do {
      printf("%s.%s.",nibbles[dbl_byte[lVar11 + -1] >> 4],nibbles[dbl_byte[lVar11 + -1] & 0xf]);
      if (((uint)lVar11 & 3) == 1 && lVar11 != 1) {
        printf("\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ");
      }
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    putchar(10);
    uVar9 = (aVar4.byte[7] & 0x7f) * 0x10;
    uVar12 = uVar12 >> 0x14 & 0xf;
    lVar11 = 0;
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)(uVar9 | uVar12),(ulong)((uVar12 + uVar9) - 0x3ff)
          );
    puts("------------------ float80 -------------------");
    printf("Bits: %zu (48 unused, 80 encoded)\n",0x80);
    uVar6 = flt80_byte[8];
    uVar5 = flt80_byte[7];
    uVar12 = (uint)flt80_byte[9];
    printf("Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",(ulong)flt80_byte[9],
           (ulong)flt80_byte[8],(ulong)flt80_byte[7],(ulong)flt80_byte[6],(ulong)flt80_byte[5],
           (ulong)flt80_byte[4],(ulong)flt80_byte[3],(ulong)flt80_byte[2],(ulong)flt80_byte[1],
           (ulong)flt80_byte[0]);
    do {
      if (flt80_byte[lVar11] != flt80.byte[lVar11]) {
        __assert_fail("flt80_byte[ i ] == flt80.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0xb1,"int main(int, char **)");
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
    printf("Bin:  seee.eeee.eeee.eeee.\n      ");
    lVar11 = 10;
    do {
      printf("%s.%s.",nibbles[flt80_byte[lVar11 + -1] >> 4],nibbles[flt80_byte[lVar11 + -1] & 0xf]);
      pcVar10 = "\n      ifff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ";
      if ((int)lVar11 == 9) {
LAB_001015dc:
        printf(pcVar10);
      }
      else if ((int)lVar11 == 5) {
        pcVar10 = "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ";
        goto LAB_001015dc;
      }
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    putchar(10);
    iVar13 = (uVar12 & 0x7f) * 0x100;
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)(iVar13 + (uint)uVar6),
           (ulong)((iVar13 + (uint)uVar6) - 0x3fff));
    printf("Dec:  %d\n",(ulong)(uVar5 >> 7));
    puts("----------------------------------------------");
    if (argc != 3) {
      return 0;
    }
    conversion[8] = '\0';
    conversion[9] = '\0';
    conversion[0] = '%';
    conversion[1] = '\0';
    conversion[2] = '\0';
    conversion[3] = '\0';
    conversion[4] = '\0';
    conversion[5] = '\0';
    conversion[6] = '\0';
    conversion[7] = '\0';
    pcVar10 = argv[2];
    if (*pcVar10 == '%') {
      pcVar10 = pcVar10 + 1;
      argv[2] = pcVar10;
    }
    sVar8 = strlen(pcVar10);
    if (sVar8 < 9) {
      strcat(conversion,pcVar10);
      sVar8 = strlen(conversion);
      (conversion + sVar8)[0] = '\n';
      (conversion + sVar8)[1] = '\0';
      dVar2 = strtod(argv[1],(char **)0x0);
      printf(conversion,SUB84(dVar2,0));
      sVar8 = strlen(conversion);
      cVar1 = conversion[sVar8];
      *(undefined2 *)(conversion + (sVar8 - 1)) =
           *(undefined2 *)(&stack0xffffffffffffff52 + sVar8 + 4);
      conversion[sVar8 + 1] = cVar1;
      (&stack0xffffffffffffff52)[sVar8 + 4] = 0x4c;
      dVar2 = strtold(argv[1],(char **)0x0);
      printf(conversion,SUB84(dVar2,0));
      return 0;
    }
    pcVar10 = "Conversion too long (8 characters max)";
  }
  puts(pcVar10);
  return 1;
}

Assistant:

int main( int argc, char * argv[] )
{
    unsigned char    flt_byte[ sizeof( float ) ];
    unsigned char    dbl_byte[ sizeof( double ) ];
#ifdef FLOAT80
    unsigned char  flt80_byte[ sizeof( long double ) ];
#endif
#ifdef FLOAT128
    unsigned char flt128_byte[ sizeof( float128_t ) ];
#endif

    int exp;

    if ( argc < 2 || argc > 3 )
    {
        puts( "Usage: fpconvert <floating-point> [<conversion>]" );
        return 1;
    }

    flt.value    =    strtof( argv[1], NULL );
    dbl.value    =    strtod( argv[1], NULL );
#ifdef FLOAT80
    flt80.value  =   strtold( argv[1], NULL );
#endif
#ifdef FLOAT128
    flt128.value = strtof128( argv[1], NULL );
#endif

    memcpy(    flt_byte,    &flt.value, sizeof( float ) );
    memcpy(    dbl_byte,    &dbl.value, sizeof( double ) );
#ifdef FLOAT80
    memcpy(  flt80_byte,  &flt80.value, sizeof( long double ) );
#endif
#ifdef FLOAT128
    memcpy( flt128_byte, &flt128.value, sizeof( float128_t ) );
#endif

    puts( "------------------- float --------------------" );

    printf( "Bits: %zu\n", sizeof( float ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.\n", flt_byte[ 3 ], flt_byte[ 2 ], flt_byte[ 1 ], flt_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( float ); ++i )
    {
        assert( flt_byte[ i ] == flt.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.efff.ffff.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( float ); i > 0; --i )
    {
        unsigned high_nibble = ( flt_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt_byte[ i - 1 ] & 0x0f ] );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt_byte[3] & 0x7f ) << 1 ) | ( (unsigned)flt_byte[2] >> 7 );

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT_BIAS );

    puts( "------------------ double --------------------" );

    printf( "Bits: %zu\n", sizeof( double ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.\n", dbl_byte[ 7 ], dbl_byte[ 6 ], dbl_byte[ 5 ], dbl_byte[ 4 ], dbl_byte[ 3 ], dbl_byte[ 2 ], dbl_byte[ 1 ], dbl_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( double ); ++i )
    {
        assert( dbl_byte[ i ] == dbl.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.eeee.ffff.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( double ); i > 0; --i )
    {
        unsigned high_nibble = ( dbl_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ dbl_byte[ i - 1 ] & 0x0f ] );
        if ( ( i > 1 ) && ( i % 4 == 1 ) ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)dbl_byte[7] & 0x7f ) << 4 ) | ( ( (unsigned)dbl_byte[6] & 0xf0 ) >> 4 );

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_DBL_BIAS );

#ifdef FLOAT80
    puts( "------------------ float80 -------------------" );

    printf( "Bits: %zu (48 unused, 80 encoded)\n", sizeof( long double ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",
            flt80_byte[ 9 ], flt80_byte[ 8 ],
            flt80_byte[ 7 ], flt80_byte[ 6 ], flt80_byte[ 5 ], flt80_byte[ 4 ],
            flt80_byte[ 3 ], flt80_byte[ 2 ], flt80_byte[ 1 ], flt80_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( long double ); ++i )
    {
        assert( flt80_byte[ i ] == flt80.byte[ i ] );
    }

    /* Printing binary dump of significant parts of register */
    printf( "Bin:  seee.eeee.eeee.eeee.\n      " );

    for ( unsigned i = sizeof( long double ) - 6; i > 0; --i )
    {
        unsigned high_nibble = ( flt80_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt80_byte[ i - 1 ] & 0x0f ] );
        if ( i == 9 ) printf( "\n      ifff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
        if ( i == 5 ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt80_byte[9] & 0x7f ) << 8 ) | (unsigned)flt80_byte[8];

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT80_BIAS );

    /* Printing decimal */
    printf( "Dec:  %d\n", ( (unsigned)flt80_byte[7] & 0x80 ) == 0x80 );

#endif

#ifdef FLOAT128
    puts( "----------------- float128 -------------------" );

    printf( "Bits: %zu\n", sizeof( float128_t ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",
            flt128_byte[ 15 ], flt128_byte[ 14 ], flt128_byte[ 13 ], flt128_byte[ 12 ],
            flt128_byte[ 11 ], flt128_byte[ 10 ], flt128_byte[  9 ], flt128_byte[  8 ],
            flt128_byte[  7 ], flt128_byte[  6 ], flt128_byte[  5 ], flt128_byte[  4 ],
            flt128_byte[  3 ], flt128_byte[  2 ], flt128_byte[  1 ], flt128_byte[  0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( float128_t ); ++i )
    {
        assert( flt128_byte[ i ] == flt128.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.eeee.eeee.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( float128_t ); i > 0; --i )
    {
        unsigned high_nibble = ( flt128_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt128_byte[ i - 1 ] & 0x0f ] );
        if ( ( i > 1 ) && ( i % 4 == 1 ) ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt128_byte[ 15 ] & 0x7f ) << 8 ) | (unsigned)flt128_byte[ 14 ];

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT128_BIAS );
#endif

    puts( "----------------------------------------------" );

    if ( argc == 3 )
    {
        char conversion[ 10 ] = "%";
        size_t len;

        if ( argv[ 2 ][ 0 ] == '%' )
        {
            ++argv[ 2 ];
        }

        if ( strlen( argv[ 2 ] ) > 8 )
        {
            puts( "Conversion too long (8 characters max)" );
            return 1;
        }

        /* Print the fp value with the conversion given */
        strcat( conversion, argv[ 2 ] );
        strcat( conversion, "\n" );
        printf( conversion, strtod( argv[ 1 ], NULL ) );

        /* Do the same with long double precision */
        len = strlen( conversion );
        memmove( conversion + len - 1, conversion + len - 2, 3 );
        conversion[ len - 2 ] = 'L';
        printf( conversion, strtold( argv[ 1 ], NULL ) );
    }
}